

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idhash.c
# Opt level: O1

int nni_id_set(nni_id_map *m,uint64_t id,void *val)

{
  uint32_t uVar1;
  nni_id_entry *pnVar2;
  int iVar3;
  int iVar4;
  uint32_t uVar5;
  size_t sVar6;
  uint uVar7;
  
  iVar3 = id_resize(m);
  iVar4 = 2;
  if (iVar3 == 0) {
    sVar6 = id_find(m,id);
    if (sVar6 == 0xffffffffffffffff) {
      uVar1 = m->id_cap;
      uVar5 = m->id_load;
      uVar7 = (uint)id;
      pnVar2 = m->id_entries;
      while( true ) {
        uVar7 = uVar7 & uVar1 - 1;
        uVar5 = uVar5 + 1;
        if (pnVar2[uVar7].val == (void *)0x0) break;
        pnVar2[uVar7].skips = pnVar2[uVar7].skips + 1;
        uVar7 = uVar7 * 5 + 1;
      }
      pnVar2 = pnVar2 + uVar7;
      m->id_load = uVar5;
      m->id_count = m->id_count + 1;
      pnVar2->key = id;
    }
    else {
      pnVar2 = m->id_entries + sVar6;
    }
    pnVar2->val = val;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int
nni_id_set(nni_id_map *m, uint64_t id, void *val)
{
	size_t        index;
	nni_id_entry *ent;

	// Try to resize -- if we don't need to, this will be a no-op.
	if (id_resize(m) != 0) {
		return (NNG_ENOMEM);
	}

	// If it already exists, just overwrite the old value.
	if ((index = id_find(m, id)) != (size_t) -1) {
		ent      = &m->id_entries[index];
		ent->val = val;
		return (0);
	}

	index = ID_INDEX(m, id);
	for (;;) {
		ent = &m->id_entries[index];

		// Increment the load count.  We do this each time time we
		// rehash.  This may over-count items that collide on the
		// same rehashing, but this should just cause a table to
		// grow sooner, which is probably a good thing.
		m->id_load++;
		if (ent->val == NULL) {
			m->id_count++;
			ent->key = id;
			ent->val = val;
			return (0);
		}
		// Record the skip count.  This being non-zero informs
		// that a rehash will be necessary.  Without this we
		// would need to scan the entire hash for the match.
		ent->skips++;
		index = ID_NEXT(m, index);
	}
}